

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

timestamp_tz_t duckdb::Cast::Operation<unsigned_char,_duckdb::timestamp_tz_t>(uchar input)

{
  bool bVar1;
  string *msg;
  bool unaff_retaddr;
  timestamp_tz_t *in_stack_00000008;
  uchar in_stack_00000017;
  timestamp_tz_t result;
  uchar in_stack_000001af;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  timestamp_t local_8;
  
  bVar1 = TryCast::Operation<unsigned_char,_duckdb::timestamp_tz_t>
                    (in_stack_00000017,in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<unsigned_char,_duckdb::timestamp_tz_t>(in_stack_000001af);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return (timestamp_tz_t)(timestamp_t)local_8.value;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}